

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>
::
ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>::VarHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>
           *this)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  BinaryReaderBase *this_00;
  undefined8 local_38;
  undefined8 uStack_30;
  ArgList local_28;
  
  iVar3 = **(int **)(this + 8);
  if (iVar3 < 1) {
    return;
  }
LAB_001a6104:
  this_00 = *(BinaryReaderBase **)this;
  pcVar1 = (this_00->super_ReaderBase).ptr_;
  (this_00->super_ReaderBase).token_ = pcVar1;
  pcVar2 = pcVar1 + 1;
  (this_00->super_ReaderBase).ptr_ = pcVar2;
  switch(*pcVar1) {
  case '0':
    (this_00->super_ReaderBase).token_ = pcVar2;
    BinaryReaderBase::Read(this_00,8);
    this_00 = *(BinaryReaderBase **)this;
    pcVar2 = (this_00->super_ReaderBase).ptr_;
  case '1':
  case '2':
  case '4':
    break;
  case '3':
    goto switchD_001a6127_caseD_33;
  case '5':
    local_38 = 0;
    uStack_30 = 0;
    local_28.types_ = 0;
    local_28.field_1.values_ = (Value *)&local_38;
    BinaryReaderBase::ReportError(this_00,(CStringRef)0x2637a8,&local_28);
  default:
    local_38 = 0;
    uStack_30 = 0;
    local_28.types_ = 0;
    local_28.field_1.values_ = (Value *)&local_38;
    BinaryReaderBase::ReportError(this_00,(CStringRef)0x263666,&local_28);
  }
  (this_00->super_ReaderBase).token_ = pcVar2;
  BinaryReaderBase::Read(this_00,8);
switchD_001a6127_caseD_33:
  iVar3 = iVar3 + -1;
  if (iVar3 == 0) {
    return;
  }
  goto LAB_001a6104;
}

Assistant:

int num_items() const { return this->reader_.header_.num_vars; }